

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::FindNextHighestCeiling(sector_t *this,vertex_t **v)

{
  line_t_conflict *plVar1;
  double dVar2;
  bool bVar3;
  vertex_t *pvVar4;
  long lVar5;
  sector_t_conflict *other;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (this->linecount == 0) {
    dVar6 = this->planes[1].TexZ;
  }
  else {
    pvVar4 = (*this->lines)->v1;
    dVar6 = ((pvVar4->p).Y * (this->ceilingplane).normal.Y +
            (this->ceilingplane).D + (pvVar4->p).X * (this->ceilingplane).normal.X) *
            (this->ceilingplane).negiC;
    if (0 < this->linecount) {
      dVar9 = 3.4028234663852886e+38;
      lVar5 = 0;
      do {
        plVar1 = this->lines[lVar5];
        if (((plVar1->flags & 4) != 0) &&
           (((other = plVar1->frontsector, other != (sector_t_conflict *)this ||
             (other = plVar1->backsector, other != (sector_t_conflict *)this)) &&
            (other != (sector_t_conflict *)0x0)))) {
          dVar8 = (plVar1->v1->p).X;
          dVar2 = (plVar1->v1->p).Y;
          dVar7 = (other->ceilingplane).negiC *
                  ((other->ceilingplane).normal.Y * dVar2 +
                  (other->ceilingplane).normal.X * dVar8 + (other->ceilingplane).D);
          dVar8 = (this->ceilingplane).negiC *
                  ((this->ceilingplane).normal.Y * dVar2 +
                  (this->ceilingplane).normal.X * dVar8 + (this->ceilingplane).D);
          if ((dVar8 < dVar7) && (dVar8 = dVar7 - dVar8, dVar8 < dVar9)) {
            bVar3 = IsLinked(this,other,true);
            if (!bVar3) {
              pvVar4 = plVar1->v1;
              dVar6 = dVar7;
              dVar9 = dVar8;
            }
          }
          dVar8 = (plVar1->v2->p).X;
          dVar2 = (plVar1->v2->p).Y;
          dVar7 = (other->ceilingplane).negiC *
                  ((other->ceilingplane).normal.Y * dVar2 +
                  (other->ceilingplane).normal.X * dVar8 + (other->ceilingplane).D);
          dVar8 = (this->ceilingplane).negiC *
                  ((this->ceilingplane).normal.Y * dVar2 +
                  (this->ceilingplane).normal.X * dVar8 + (this->ceilingplane).D);
          if ((dVar8 < dVar7) && (dVar8 = dVar7 - dVar8, dVar8 < dVar9)) {
            bVar3 = IsLinked(this,other,true);
            if (!bVar3) {
              pvVar4 = plVar1->v2;
              dVar6 = dVar7;
              dVar9 = dVar8;
            }
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->linecount);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar4;
    }
  }
  return dVar6;
}

Assistant:

double sector_t::FindNextHighestCeiling (vertex_t **v) const
{
	double height;
	double heightdiff;
	double oceil, ceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = ceilingplane.ZatPoint(spot);
	heightdiff = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			ceil = ceilingplane.ZatPoint(check->v1);
			if (oceil > ceil && oceil - ceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = oceil - ceil;
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			ceil = ceilingplane.ZatPoint(check->v2);
			if (oceil > ceil && oceil - ceil < heightdiff && !IsLinked(other, true))
			{
				heightdiff = oceil - ceil;
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}